

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_thread.hpp
# Opt level: O0

size_t __thiscall
so_5::disp::reuse::work_thread::demand_queue_details::
queue_template_t<so_5::disp::reuse::work_thread::demand_queue_details::no_activity_tracking_impl_t>
::demands_count(queue_template_t<so_5::disp::reuse::work_thread::demand_queue_details::no_activity_tracking_impl_t>
                *this,demands_counter_t *external_counter)

{
  _func_int **pp_Var1;
  lock_guard_t lVar2;
  type lock_00;
  size_type sVar3;
  lock_guard_t local_38;
  lock_guard_t lock;
  demands_counter_t *external_counter_local;
  queue_template_t<so_5::disp::reuse::work_thread::demand_queue_details::no_activity_tracking_impl_t>
  *this_local;
  memory_order __b;
  
  lock.m_lock = (lock_t *)external_counter;
  lock_00 = std::
            unique_ptr<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>
            ::operator*(&(this->super_no_activity_tracking_impl_t).super_common_data_t.m_lock);
  mpsc_queue_traits::lock_guard_t::lock_guard_t(&local_38,lock_00);
  sVar3 = std::deque<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_>::size
                    ((deque<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_> *)
                     &this->super_no_activity_tracking_impl_t);
  lVar2 = lock;
  std::operator&(memory_order_acquire,__memory_order_mask);
  pp_Var1 = (lVar2.m_lock)->_vptr_lock_t;
  mpsc_queue_traits::lock_guard_t::~lock_guard_t(&local_38);
  return sVar3 + (long)pp_Var1;
}

Assistant:

std::size_t
	demands_count( const demands_counter_t & external_counter )
	{
		queue_traits::lock_guard_t lock{ *(this->m_lock) };

		return this->m_demands.size()
				+ external_counter.load( std::memory_order_acquire );
	}